

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_FEA_basic.cpp
# Opt level: O2

void test_5(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  element_type *peVar13;
  element_type *peVar14;
  ChStreamOutAscii *pCVar15;
  __shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> *this;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  shared_ptr<chrono::fea::ChNodeFEAxyz> sVar28;
  shared_ptr<chrono::fea::ChMesh> my_mesh;
  ChVector<double> v;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode7;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode6;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode5;
  shared_ptr<chrono::ChBody> truss;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode4;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode3;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode2;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode1;
  double local_9c8;
  undefined8 uStack_9c0;
  undefined1 local_9b8 [16];
  double local_9a8;
  shared_ptr<chrono::fea::ChElementHexaCorot_20> melement1;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode16;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode15;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode14;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode13;
  shared_ptr<chrono::fea::ChContinuumElastic> mmaterial;
  shared_ptr<chrono::ChSolverMINRES> solver;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint4;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint3;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint2;
  shared_ptr<chrono::fea::ChLinkPointFrame> constraint1;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode20;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode19;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode18;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode17;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode12;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode11;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode10;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode9;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_868;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_858;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_848;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_838;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_828;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_818;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_808;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_7f8;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_7e8;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_7d8;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_7c8;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_7b8;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_7a8;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_798;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_788;
  __shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2> local_778 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_770;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_768 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_760;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_758 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_750;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_748 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_740;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_738 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_730;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_728 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_720;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_718;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_708 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_700;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_6f8;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_6e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6e0;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_6d8;
  __shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2> local_6c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6c0;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_6b8;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_6a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6a0;
  __shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2> local_698 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_690;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_688 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_680;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_678;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_668;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_658;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_648;
  __shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> local_638;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_628 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_620;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_618 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_610;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_608 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_600;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_5f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5f0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_5e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_5d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5d0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_5c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5c0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_5b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5b0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_5a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5a0;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_598 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_590;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_588 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_580;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_578 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_570;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_568 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_560;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_558 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_550;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_548 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_540;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_538 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_530;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_528 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_520;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_518 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_510;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_508 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_500;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_4f8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4f0;
  __shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> local_4e8;
  double local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined1 local_4b8 [16];
  undefined8 local_4a8;
  double local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined1 local_478 [16];
  undefined8 local_468;
  double local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined1 local_438 [16];
  undefined8 local_428;
  double local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined1 local_3f8 [16];
  undefined8 local_3e8;
  ChSystemSMC sys;
  
  pCVar15 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar15,"\n-------------------------------------------------\n");
  pCVar15 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar15,"TEST: QUADRATIC hexahedral element FEM  \n\n");
  chrono::ChSystemSMC::ChSystemSMC(&sys,true);
  std::make_shared<chrono::fea::ChMesh>();
  std::make_shared<chrono::fea::ChContinuumElastic>();
  chrono::fea::ChContinuumElastic::Set_E(207000000.0);
  chrono::fea::ChContinuumElastic::Set_v(0.3);
  v.m_data[2] = 0.0;
  v.m_data._0_16_ = ZEXT816(0);
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode1);
  v.m_data._0_16_ = ZEXT816(0);
  v.m_data[2] = 0.01;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode2);
  v.m_data._0_16_ = ZEXT816(0x3f847ae147ae147b);
  v.m_data[2] = 0.01;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode3);
  v.m_data._0_16_ = ZEXT816(0x3f847ae147ae147b);
  v.m_data[2] = 0.0;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode4);
  v.m_data._0_16_ = vmovhpd_avx(ZEXT816(0) << 0x40,0x3fb999999999999a);
  v.m_data[2] = 0.0;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode5);
  v.m_data._0_16_ = vmovhpd_avx(ZEXT816(0) << 0x40,0x3fb999999999999a);
  v.m_data[2] = 0.01;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode6);
  v.m_data[0] = 0.01;
  v.m_data[1] = 0.1;
  v.m_data[2] = 0.01;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode7);
  v.m_data[1] = 0.1;
  v.m_data[0] = 0.01;
  v.m_data[2] = 0.0;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode8);
  auVar16._0_8_ =
       *(double *)
        (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar16._8_8_ =
       *(double *)
        (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar1._8_8_ = 0x3fe0000000000000;
  auVar1._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar16,auVar1);
  v.m_data[2] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode9);
  auVar17._0_8_ =
       *(double *)
        (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar17._8_8_ =
       *(double *)
        (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar2._8_8_ = 0x3fe0000000000000;
  auVar2._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar17,auVar2);
  v.m_data[2] = (*(double *)
                  (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode10)
  ;
  auVar18._0_8_ =
       *(double *)
        (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar18._8_8_ =
       *(double *)
        (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar3._8_8_ = 0x3fe0000000000000;
  auVar3._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar18,auVar3);
  v.m_data[2] = (*(double *)
                  (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode11)
  ;
  auVar19._0_8_ =
       *(double *)
        (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar19._8_8_ =
       *(double *)
        (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar4._8_8_ = 0x3fe0000000000000;
  auVar4._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar19,auVar4);
  v.m_data[2] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode12)
  ;
  auVar20._0_8_ =
       *(double *)
        (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar20._8_8_ =
       *(double *)
        (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar5._8_8_ = 0x3fe0000000000000;
  auVar5._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar20,auVar5);
  v.m_data[2] = (*(double *)
                  (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode13)
  ;
  auVar21._0_8_ =
       *(double *)
        (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar21._8_8_ =
       *(double *)
        (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar6._8_8_ = 0x3fe0000000000000;
  auVar6._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar21,auVar6);
  v.m_data[2] = (*(double *)
                  (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode14)
  ;
  auVar22._0_8_ =
       *(double *)
        (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar22._8_8_ =
       *(double *)
        (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar7._8_8_ = 0x3fe0000000000000;
  auVar7._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar22,auVar7);
  v.m_data[2] = (*(double *)
                  (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode15)
  ;
  auVar23._0_8_ =
       *(double *)
        (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar23._8_8_ =
       *(double *)
        (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar8._8_8_ = 0x3fe0000000000000;
  auVar8._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar23,auVar8);
  v.m_data[2] = (*(double *)
                  (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode16)
  ;
  auVar24._0_8_ =
       *(double *)
        (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar24._8_8_ =
       *(double *)
        (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar9._8_8_ = 0x3fe0000000000000;
  auVar9._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar24,auVar9);
  v.m_data[2] = (*(double *)
                  (mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode17)
  ;
  auVar25._0_8_ =
       *(double *)
        (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar25._8_8_ =
       *(double *)
        (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar10._8_8_ = 0x3fe0000000000000;
  auVar10._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar25,auVar10);
  v.m_data[2] = (*(double *)
                  (mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode18)
  ;
  auVar26._0_8_ =
       *(double *)
        (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar26._8_8_ =
       *(double *)
        (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar11._8_8_ = 0x3fe0000000000000;
  auVar11._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar26,auVar11);
  v.m_data[2] = (*(double *)
                  (mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>((ChVector<double> *)&mnode19)
  ;
  auVar27._0_8_ =
       *(double *)
        (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x20) + *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x20);
  auVar27._8_8_ =
       *(double *)
        (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
        0x28) + *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x28);
  auVar12._8_8_ = 0x3fe0000000000000;
  auVar12._0_8_ = 0x3fe0000000000000;
  v.m_data._0_16_ = vmulpd_avx512vl(auVar27,auVar12);
  v.m_data[2] = (*(double *)
                  (mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 0x30) +
                *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30)) * 0.5;
  sVar28 = std::make_shared<chrono::fea::ChNodeFEAxyz,chrono::ChVector<double>>
                     ((ChVector<double> *)&mnode20);
  auVar1 = vmovhpd_avx(ZEXT816(0) << 0x40,0xc07f400000000000);
  local_3e8 = 0;
  local_3f8 = auVar1;
  (**(code **)(*(long *)mnode5.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))
            (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,local_3f8,
             sVar28.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi._M_pi);
  local_9c8 = auVar1._0_8_;
  uStack_9c0 = auVar1._8_8_;
  local_418 = local_9c8;
  uStack_410 = uStack_9c0;
  local_408 = 0;
  (**(code **)(*(long *)mnode6.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  auVar1 = vmovhpd_avx(ZEXT816(0),0xc07f400000000000);
  local_428 = 0;
  local_438 = auVar1;
  (**(code **)(*(long *)mnode7.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_9c8 = auVar1._0_8_;
  uStack_9c0 = auVar1._8_8_;
  local_458 = local_9c8;
  uStack_450 = uStack_9c0;
  local_448 = 0;
  (**(code **)(*(long *)mnode8.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  auVar1 = vmovhpd_avx(ZEXT816(0),0xc07f400000000000);
  local_468 = 0;
  local_478 = auVar1;
  (**(code **)(*(long *)mnode13.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_9c8 = auVar1._0_8_;
  uStack_9c0 = auVar1._8_8_;
  local_498 = local_9c8;
  uStack_490 = uStack_9c0;
  local_488 = 0;
  (**(code **)(*(long *)mnode14.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  auVar1 = vmovhpd_avx(ZEXT816(0),0xc07f400000000000);
  local_4a8 = 0;
  local_4b8 = auVar1;
  (**(code **)(*(long *)mnode15.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  local_9c8 = auVar1._0_8_;
  uStack_9c0 = auVar1._8_8_;
  local_4d8 = local_9c8;
  uStack_4d0 = uStack_9c0;
  local_4c8 = 0;
  (**(code **)(*(long *)mnode16.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x68))();
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_4f8,
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_4f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4f0);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_508,
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_508);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_500);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_518,
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_518);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_510);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_528,
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_528);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_520);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_538,
             &mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_538);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_530);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_548,
             &mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_548);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_540);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_558,
             &mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_558);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_550);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_568,
             &mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_568);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_560);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_578,
             &mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_578);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_570);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_588,
             &mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_588);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_580);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_598,
             &mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_598);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_590);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_5a8,
             &mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_5a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5a0);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_5b8,
             &mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_5b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5b0);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_5c8,
             &mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_5c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5c0);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_5d8,
             &mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_5d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5d0);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_5e8,
             &mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_5e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5e0);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_5f8,
             &mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_5f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_5f0);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_608,
             &mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_608);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_600);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_618,
             &mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_618);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_610);
  peVar13 = my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChNodeFEAxyz,void>
            (local_628,
             &mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddNode(peVar13,local_628);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_620);
  std::make_shared<chrono::fea::ChElementHexaCorot_20>();
  peVar14 = melement1.
            super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_788,
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_798,
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7a8,
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7b8,
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7c8,
             &mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7d8,
             &mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7e8,
             &mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_7f8,
             &mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_808,
             &mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_818,
             &mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_828,
             &mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_838,
             &mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_848,
             &mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_858,
             &mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_868,
             &mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_638,
             &mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_648,
             &mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_658,
             &mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_668,
             &mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_678,
             &mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)peVar14 + 0x38))
            (peVar14,&local_788,&local_798,&local_7a8,&local_7b8,&local_7c8,&local_7d8,&local_7e8,
             &local_7f8,&local_808,&local_818,&local_828,&local_838,&local_848,&local_858,&local_868
             ,&local_638,&local_648,&local_658,&local_668,&local_678);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_678._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_668._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_658._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_648._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_638._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_868._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_858._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_848._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_838._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_828._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_818._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_808._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7f8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7e8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7d8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7c8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7b8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_7a8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_798._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_788._M_refcount);
  this = (__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2> *)
         (melement1.
          super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         + 0xb8);
  std::__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_4e8,
             &mmaterial.
              super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>::operator=
            (this,&local_4e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_4e8._M_refcount);
  (**(code **)(*(long *)melement1.
                        super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x48))();
  std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChElementHexaCorot_20,void>
            (local_688,
             &melement1.
              super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>);
  chrono::fea::ChMesh::AddElement
            (my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             local_688);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_680);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChMesh,void>
            (local_698,&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)
  ;
  chrono::ChSystem::Add(&sys,local_698);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_690);
  chrono_types::make_shared<chrono::ChBody,_0>();
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_6a8,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_6a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6a0);
  chrono::ChBody::SetBodyFixed
            ((bool)truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_
            );
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  std::make_shared<chrono::fea::ChLinkPointFrame>();
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_6b8,
             &mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_6c8,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)constraint1.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint1.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_6b8,local_6c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6c0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6b8._M_refcount);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_6d8,
             &mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_6e8,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)constraint2.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint2.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_6d8,local_6e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6d8._M_refcount);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_6f8,
             &mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_708,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)constraint3.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint3.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_6f8,local_708);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_700);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6f8._M_refcount);
  std::__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_718,
             &mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBodyFrame,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChBody,void>
            (local_728,&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  (**(code **)(*(long *)constraint4.
                        super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr + 0x220))
            (constraint4.
             super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_718,local_728,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_720);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_718._M_refcount);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_738,
             &constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_738);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_730);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_748,
             &constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_748);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_740);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_758,
             &constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_758);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_750);
  std::__shared_ptr<chrono::ChPhysicsItem,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::fea::ChLinkPointFrame,void>
            (local_768,
             &constraint4.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::Add(&sys,local_768);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_760);
  std::make_shared<chrono::ChSolverMINRES>();
  std::__shared_ptr<chrono::ChSolver,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChSolverMINRES,void>
            (local_778,
             &solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>);
  chrono::ChSystem::SetSolver(&sys,local_778);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_770);
  *(undefined4 *)
   (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0xc) =
       100;
  *(undefined8 *)
   (solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x10) =
       0x3d719799812dea11;
  solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr[8] =
       (element_type)0x1;
  solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>._M_ptr[0x20] =
       (element_type)0x1;
  chrono::ChSystem::DoStaticLinear();
  pCVar15 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar15 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar15,"node5 displ: ");
  (**(code **)(*(long *)mnode5.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (local_9b8,
             mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])
                   (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x20),local_9b8);
  v.m_data[2] = *(double *)
                 (mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30) - local_9a8;
  pCVar15 = chrono::operator<<(pCVar15,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar15,"\n");
  pCVar15 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar15 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar15,"node6 displ: ");
  (**(code **)(*(long *)mnode6.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (local_9b8,
             mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])
                   (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x20),local_9b8);
  v.m_data[2] = *(double *)
                 (mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30) - local_9a8;
  pCVar15 = chrono::operator<<(pCVar15,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar15,"\n");
  pCVar15 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar15 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar15,"node7 displ: ");
  (**(code **)(*(long *)mnode7.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (local_9b8,
             mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])
                   (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x20),local_9b8);
  v.m_data[2] = *(double *)
                 (mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30) - local_9a8;
  pCVar15 = chrono::operator<<(pCVar15,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar15,"\n");
  pCVar15 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar15 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar15,"node8 displ: ");
  (**(code **)(*(long *)mnode8.
                        super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr + 0x60))
            (local_9b8,
             mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  v.m_data._0_16_ =
       vsubpd_avx(*(undefined1 (*) [16])
                   (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x20),local_9b8);
  v.m_data[2] = *(double *)
                 (mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr + 0x30) - local_9a8;
  pCVar15 = chrono::operator<<(pCVar15,&v);
  chrono::ChStreamOutAscii::operator<<(pCVar15,"\n");
  pCVar15 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar15 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar15,"Element volume");
  pCVar15 = (ChStreamOutAscii *)
            chrono::ChStreamOutAscii::operator<<
                      (pCVar15,*(double *)
                                (melement1.
                                 super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x100));
  chrono::ChStreamOutAscii::operator<<(pCVar15,"\n");
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&solver.super___shared_ptr<chrono::ChSolverMINRES,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraint4.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraint3.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraint2.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&constraint1.
              super___shared_ptr<chrono::fea::ChLinkPointFrame,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&truss.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&melement1.
              super___shared_ptr<chrono::fea::ChElementHexaCorot_20,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode20.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode19.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode18.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode17.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode16.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode15.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode14.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode13.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode12.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode11.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode10.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode9.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode7.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode6.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode5.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode4.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode3.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode2.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mnode1.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&mmaterial.
              super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_mesh.super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  chrono::ChSystemSMC::~ChSystemSMC(&sys);
  return;
}

Assistant:

void test_5() {
    GetLog() << "\n-------------------------------------------------\n";
    GetLog() << "TEST: QUADRATIC hexahedral element FEM  \n\n";

    // The physical system: it contains all physical objects.
    ChSystemSMC sys;

    // Create a mesh, that is a container for groups
    // of elements and their referenced nodes.
    auto my_mesh = chrono_types::make_shared<ChMesh>();

    // Create a material, that must be assigned to each element,
    // and set its parameters
    auto mmaterial = chrono_types::make_shared<ChContinuumElastic>();
    mmaterial->Set_E(207e6);
    mmaterial->Set_v(0.3);

    // Create some nodes. These are the classical point-like
    // nodes with x,y,z degrees of freedom, that can be used
    // for many types of FEM elements in space.
    // While creating them, also set X0 undeformed positions.
    double sx = 0.01;
    double sy = 0.1;
    double sz = 0.01;
    auto mnode1 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, 0));
    auto mnode2 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, 0, sz));
    auto mnode3 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, 0, sz));
    auto mnode4 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, 0, 0));
    auto mnode5 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, sy, 0));
    auto mnode6 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(0, sy, sz));
    auto mnode7 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, sy, sz));
    auto mnode8 = chrono_types::make_shared<ChNodeFEAxyz>(ChVector<>(sx, sy, 0));
    auto mnode9 = chrono_types::make_shared<ChNodeFEAxyz>((mnode1->pos + mnode2->pos) * 0.5);  // in between front face
    auto mnode10 = chrono_types::make_shared<ChNodeFEAxyz>((mnode2->pos + mnode3->pos) * 0.5);
    auto mnode11 = chrono_types::make_shared<ChNodeFEAxyz>((mnode3->pos + mnode4->pos) * 0.5);
    auto mnode12 = chrono_types::make_shared<ChNodeFEAxyz>((mnode1->pos + mnode4->pos) * 0.5);
    auto mnode13 = chrono_types::make_shared<ChNodeFEAxyz>((mnode5->pos + mnode6->pos) * 0.5);  // in between back face
    auto mnode14 = chrono_types::make_shared<ChNodeFEAxyz>((mnode6->pos + mnode7->pos) * 0.5);
    auto mnode15 = chrono_types::make_shared<ChNodeFEAxyz>((mnode7->pos + mnode8->pos) * 0.5);
    auto mnode16 = chrono_types::make_shared<ChNodeFEAxyz>((mnode8->pos + mnode5->pos) * 0.5);
    auto mnode17 = chrono_types::make_shared<ChNodeFEAxyz>((mnode2->pos + mnode6->pos) * 0.5);  // in between side edges
    auto mnode18 = chrono_types::make_shared<ChNodeFEAxyz>((mnode3->pos + mnode7->pos) * 0.5);
    auto mnode19 = chrono_types::make_shared<ChNodeFEAxyz>((mnode4->pos + mnode8->pos) * 0.5);
    auto mnode20 = chrono_types::make_shared<ChNodeFEAxyz>((mnode1->pos + mnode5->pos) * 0.5);

    // For example, set applied forces to nodes:
    mnode5->SetForce(ChVector<>(0, -500, 0));
    mnode6->SetForce(ChVector<>(0, -500, 0));
    mnode7->SetForce(ChVector<>(0, -500, 0));
    mnode8->SetForce(ChVector<>(0, -500, 0));
    mnode13->SetForce(ChVector<>(0, -500, 0));
    mnode14->SetForce(ChVector<>(0, -500, 0));
    mnode15->SetForce(ChVector<>(0, -500, 0));
    mnode16->SetForce(ChVector<>(0, -500, 0));

    // Remember to add nodes and elements to the mesh!
    my_mesh->AddNode(mnode1);
    my_mesh->AddNode(mnode2);
    my_mesh->AddNode(mnode3);
    my_mesh->AddNode(mnode4);
    my_mesh->AddNode(mnode5);
    my_mesh->AddNode(mnode6);
    my_mesh->AddNode(mnode7);
    my_mesh->AddNode(mnode8);
    my_mesh->AddNode(mnode9);
    my_mesh->AddNode(mnode10);
    my_mesh->AddNode(mnode11);
    my_mesh->AddNode(mnode12);
    my_mesh->AddNode(mnode13);
    my_mesh->AddNode(mnode14);
    my_mesh->AddNode(mnode15);
    my_mesh->AddNode(mnode16);
    my_mesh->AddNode(mnode17);
    my_mesh->AddNode(mnode18);
    my_mesh->AddNode(mnode19);
    my_mesh->AddNode(mnode20);

    // Create the tetrahedron element, and assign
    // its nodes and material
    auto melement1 = chrono_types::make_shared<ChElementHexaCorot_20>();
    melement1->SetNodes(mnode1, mnode2, mnode3, mnode4, mnode5, mnode6, mnode7, mnode8, mnode9, mnode10, mnode11,
                        mnode12, mnode13, mnode14, mnode15, mnode16, mnode17, mnode18, mnode19, mnode20);
    melement1->SetMaterial(mmaterial);

    // Use this statement to use the reduced integration
    // Default number of gauss point: 27. Reduced integration -> 8 Gp.
    melement1->SetReducedIntegrationRule();

    // Remember to add elements to the mesh!
    my_mesh->AddElement(melement1);

    // Remember to add the mesh to the system!
    sys.Add(my_mesh);

    // Create also a truss
    auto truss = chrono_types::make_shared<ChBody>();
    sys.Add(truss);
    truss->SetBodyFixed(true);

    // Create a constraint between a node and the truss
    auto constraint1 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint2 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint3 = chrono_types::make_shared<ChLinkPointFrame>();
    auto constraint4 = chrono_types::make_shared<ChLinkPointFrame>();

    constraint1->Initialize(mnode1,   // node
                            truss);   // body to be connected to

    constraint2->Initialize(mnode2,   // node
                            truss);   // body to be connected to

    constraint3->Initialize(mnode3,   // node
                            truss);   // body to be connected to

    constraint4->Initialize(mnode4,   // node
                            truss);   // body to be connected to

    sys.Add(constraint1);
    sys.Add(constraint2);
    sys.Add(constraint3);
    sys.Add(constraint4);

    // Set no gravity
    // sys.Set_G_acc(VNULL);

    // Perform a linear static analysis
    auto solver = chrono_types::make_shared<ChSolverMINRES>();
    sys.SetSolver(solver);
    solver->SetMaxIterations(100);
    solver->SetTolerance(1e-12);
    solver->EnableDiagonalPreconditioner(true);
    solver->SetVerbose(true);

    sys.DoStaticLinear();

    // Output some results
    GetLog() << "node5 displ: " << mnode5->GetPos() - mnode5->GetX0() << "\n";
    GetLog() << "node6 displ: " << mnode6->GetPos() - mnode6->GetX0() << "\n";
    GetLog() << "node7 displ: " << mnode7->GetPos() - mnode7->GetX0() << "\n";
    GetLog() << "node8 displ: " << mnode8->GetPos() - mnode8->GetX0() << "\n";
    GetLog() << "Element volume" << melement1->GetVolume() << "\n";
}